

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

string * __thiscall test_pool2d::vars_abi_cxx11_(string *__return_storage_ptr__,test_pool2d *this)

{
  ggml_op_pool __val;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  string local_410;
  string local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  string local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  string local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  __val = this->pool_type;
  if (__val == GGML_OP_POOL_MAX) {
    __s = "max";
  }
  else {
    if (__val != GGML_OP_POOL_AVG) {
      std::__cxx11::to_string(&local_410,__val);
      goto LAB_001207cf;
    }
    __s = "avg";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,__s,(allocator<char> *)&local_430);
LAB_001207cf:
  std::operator+(&local_210,"pool_type=",&local_410);
  std::operator+(&local_1f0,&local_210,",");
  var_to_str_abi_cxx11_(&local_230,this->type_input);
  std::operator+(&local_430,"type_input=",&local_230);
  std::operator+(&local_1d0,&local_1f0,&local_430);
  std::operator+(&local_1b0,&local_1d0,",");
  var_to_str<long,4ul>(&local_270,&this->ne_input);
  std::operator+(&local_250,"ne_input=",&local_270);
  std::operator+(&local_190,&local_1b0,&local_250);
  std::operator+(&local_170,&local_190,",");
  var_to_str<int>(&local_2b0,&this->k0);
  std::operator+(&local_290,"k0=",&local_2b0);
  std::operator+(&local_150,&local_170,&local_290);
  std::operator+(&local_130,&local_150,",");
  var_to_str<int>(&local_2f0,&this->k1);
  std::operator+(&local_2d0,"k1=",&local_2f0);
  std::operator+(&local_110,&local_130,&local_2d0);
  std::operator+(&local_f0,&local_110,",");
  var_to_str<int>(&local_330,&this->s0);
  std::operator+(&local_310,"s0=",&local_330);
  std::operator+(&local_d0,&local_f0,&local_310);
  std::operator+(&local_b0,&local_d0,",");
  var_to_str<int>(&local_370,&this->s1);
  std::operator+(&local_350,"s1=",&local_370);
  std::operator+(&local_90,&local_b0,&local_350);
  std::operator+(&local_70,&local_90,",");
  var_to_str<int>(&local_3b0,&this->p0);
  std::operator+(&local_390,"p0=",&local_3b0);
  std::operator+(&local_50,&local_70,&local_390);
  std::operator+(&local_30,&local_50,",");
  var_to_str<int>(&local_3f0,&this->p1);
  std::operator+(&local_3d0,"p1=",&local_3f0);
  std::operator+(__return_storage_ptr__,&local_30,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_410);
  return __return_storage_ptr__;
}

Assistant:

std::string vars() override {
        return VARS_TO_STR9(pool_type, type_input, ne_input, k0, k1, s0, s1, p0, p1);
    }